

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2scan_x.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar20;
  undefined1 auVar21 [16];
  ulong uVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 uStack_104;
  undefined4 uStack_100;
  
  dVar32 = 1.0 / (rho_a + rho_b);
  dVar4 = (rho_a - rho_b) * dVar32;
  dVar5 = cbrt(1e-15);
  dVar6 = cbrt(rho_a + rho_b);
  dVar7 = cbrt(rho_a);
  dVar8 = cbrt(rho_b);
  uVar2 = -(ulong)(dVar32 * (rho_a + rho_a) <= 1e-15);
  uVar3 = -(ulong)(dVar32 * (rho_b + rho_b) <= 1e-15);
  auVar25._0_8_ = ~uVar2 & (ulong)(1.0 - dVar4);
  auVar25._8_8_ = ~uVar3 & (ulong)(dVar4 + 1.0);
  auVar21._0_8_ = uVar2 & 0x3ffffffffffffffc;
  auVar21._8_8_ = uVar3 & 0x3ffffffffffffffc;
  auVar21 = auVar21 | auVar25;
  auVar26._0_8_ = auVar21._8_8_;
  auVar26._8_4_ = auVar21._0_4_;
  auVar26._12_4_ = auVar21._4_4_;
  uVar22 = ~uVar3 & auVar26._8_8_;
  dVar32 = (double)(uVar2 & 0x3cd2000000000000 | ~uVar2 & auVar26._0_8_);
  dVar19 = (double)(uVar3 & 0x3cd2000000000000 | uVar22);
  dVar9 = cbrt(dVar32);
  uStack_104 = (undefined4)((ulong)dVar32 >> 0x20);
  uStack_100 = (undefined4)uVar22;
  dVar10 = cbrt((double)CONCAT44(uStack_104,uStack_100));
  dVar4 = rho_a * rho_a;
  dVar11 = exp((((1.0 / dVar7) / (dVar4 * dVar4 * rho_a)) * sigma_aa * sigma_aa *
                -0.1559676420330081 * 58.88045974722155) / 576.0);
  dVar33 = rho_b * rho_b;
  auVar27._0_8_ = dVar7 * dVar7 * dVar4;
  auVar27._8_8_ = dVar33 * dVar8 * dVar8;
  auVar27 = divpd(_DAT_010020a0,auVar27);
  auVar17._8_8_ = dVar8 * dVar8 * rho_b;
  auVar17._0_8_ = dVar7 * dVar7 * rho_a;
  auVar17 = divpd(_DAT_010020a0,auVar17);
  dVar31 = auVar27._0_8_;
  dVar14 = auVar27._8_8_;
  auVar18._0_8_ = sigma_aa * 0.001 * dVar31 * 0.125 + 4.557799872345597;
  auVar18._8_8_ = sigma_bb * 0.001 * dVar14 * 0.125 + 4.557799872345597;
  auVar27 = divpd(_DAT_010020a0,auVar18);
  dVar20 = auVar27._0_8_ * (sigma_aa * dVar31 * -0.125 + auVar17._0_8_ * tau_a);
  dVar23 = auVar27._8_8_ * (sigma_bb * dVar14 * -0.125 + auVar17._8_8_ * tau_b);
  dVar4 = 0.0;
  if (dVar20 <= 0.0) {
    dVar4 = dVar20;
  }
  dVar4 = exp(dVar4 * -0.667 * (1.0 / (1.0 - dVar4)));
  dVar12 = exp((double)(~-(ulong)(2.5 < dVar20) & 0xbfe1111111111111 |
                       (ulong)(0.8 / (1.0 - dVar20)) & -(ulong)(2.5 < dVar20)));
  auVar1._8_8_ = dVar23;
  auVar1._0_8_ = dVar20;
  auVar17 = minpd(_DAT_01002c50,auVar1);
  if (sigma_aa < 0.0) {
    dVar13 = sqrt(sigma_aa);
  }
  else {
    dVar13 = SQRT(sigma_aa);
  }
  uVar2 = -(ulong)(dVar19 <= 1e-15);
  local_118 = auVar17._0_8_;
  uStack_110 = auVar17._8_8_;
  dVar24 = local_118 * local_118;
  dVar30 = uStack_110 * uStack_110;
  dVar7 = (1.0 / (dVar7 * rho_a)) * dVar13 * 1.5393389262365065;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar13 = exp(-17.140028381540095 / dVar7);
  dVar7 = exp((((1.0 / dVar8) / (dVar33 * dVar33 * rho_b)) * sigma_bb * sigma_bb *
               -0.1559676420330081 * 58.88045974722155) / 576.0);
  auVar28._0_8_ =
       dVar31 * (dVar11 * -0.12082102608751867 + 0.12345679012345678) * 1.8171205928321397 *
                sigma_aa * 0.21733691746289932;
  auVar28._8_8_ =
       dVar14 * sigma_bb * 0.21733691746289932 *
                (dVar7 * -0.12082102608751867 + 0.12345679012345678) * 1.8171205928321397;
  auVar17 = divpd(auVar28,_DAT_01002130);
  auVar29._0_8_ = auVar17._0_8_ + (double)DAT_01002ad0;
  auVar29._8_8_ = auVar17._8_8_ + DAT_01002ad0._8_8_;
  auVar17 = divpd(_DAT_01002ad0,auVar29);
  dVar11 = (1.0 - auVar17._0_8_) * (double)DAT_01002ad0;
  dVar31 = (1.0 - auVar17._8_8_) * DAT_01002ad0._8_8_;
  dVar7 = 0.0;
  if (dVar23 <= 0.0) {
    dVar7 = dVar23;
  }
  dVar7 = exp(dVar7 * -0.667 * (1.0 / (1.0 - dVar7)));
  dVar14 = dVar24 * dVar24;
  dVar33 = dVar30 * dVar30;
  if (2.5 < dVar20) {
    dVar15 = 0.8 / (1.0 - dVar23);
  }
  else {
    dVar15 = -0.5333333333333333;
  }
  dVar15 = exp(dVar15);
  if (sigma_bb < 0.0) {
    dVar16 = sqrt(sigma_bb);
  }
  else {
    dVar16 = SQRT(sigma_bb);
  }
  dVar8 = (1.0 / (dVar8 * rho_b)) * dVar16 * 1.5393389262365065;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar8 = exp(-17.140028381540095 / dVar8);
  *eps = (double)(-(ulong)(1e-11 < rho_b) &
                 (ulong)((double)((ulong)(dVar5 * 1e-15) & uVar2 | ~uVar2 & (ulong)(dVar10 * dVar19)
                                 ) * 0.9847450218426964 * -0.375 *
                        (1.0 - dVar8) *
                        dVar6 * ((0.174 - dVar31) *
                                 (double)(~-(ulong)(dVar23 <= 0.0) &
                                          (~-(ulong)(dVar23 <= 2.5) & (ulong)(dVar15 * -1.24) |
                                          (ulong)(dVar33 * -0.023185843322 * uStack_110 * dVar30 +
                                                 dVar30 * dVar33 * 0.234528941479 +
                                                 uStack_110 * dVar33 * -0.887998041597 +
                                                 dVar33 * 1.45129704449 +
                                                 uStack_110 * dVar30 * -0.663086601049 +
                                                 dVar30 * -0.4445555 + uStack_110 * -0.667 + 1.0) &
                                          -(ulong)(dVar23 <= 2.5)) |
                                         (ulong)dVar7 & -(ulong)(dVar23 <= 0.0)) + dVar31 + 1.0))) +
         (double)(-(ulong)(1e-11 < rho_a) &
                 (ulong)((double)((ulong)(dVar5 * 1e-15) & -(ulong)(dVar32 <= 1e-15) |
                                 ~-(ulong)(dVar32 <= 1e-15) & (ulong)(dVar9 * dVar32)) *
                         0.9847450218426964 * -0.375 *
                        (1.0 - dVar13) *
                        dVar6 * ((0.174 - dVar11) *
                                 (double)(~-(ulong)(dVar20 <= 0.0) &
                                          (~-(ulong)(dVar20 <= 2.5) & (ulong)(dVar12 * -1.24) |
                                          (ulong)(dVar14 * -0.023185843322 * local_118 * dVar24 +
                                                 dVar24 * dVar14 * 0.234528941479 +
                                                 local_118 * dVar14 * -0.887998041597 +
                                                 dVar14 * 1.45129704449 +
                                                 local_118 * dVar24 * -0.663086601049 +
                                                 dVar24 * -0.4445555 + local_118 * -0.667 + 1.0) &
                                          -(ulong)(dVar20 <= 2.5)) |
                                         (ulong)dVar4 & -(ulong)(dVar20 <= 0.0)) + dVar11 + 1.0)));
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps ) {

    (void)(sigma_ab);
    (void)(lapl_a);
    (void)(lapl_b);
    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t4 = constants::m_cbrt_pi;
    constexpr double t31 = constants::m_cbrt_6;
    constexpr double t33 = constants::m_pi_sq;
    constexpr double t34 = constants::m_cbrt_pi_sq;
    constexpr double t6 = t3 / t4;
    constexpr double t30 = 0.2e2 / 0.27e2 + 0.5e1 / 0.3e1 * eta;
    constexpr double t32 = t31 * t31;
    constexpr double t35 = t34 * t33;
    constexpr double t36 = 0.1e1 / t35;
    constexpr double t37 = t32 * t36;
    constexpr double t46 = dp2 * dp2;
    constexpr double t47 = t46 * t46;
    constexpr double t48 = 0.1e1 / t47;
    constexpr double t57 = t34 * t34;
    constexpr double t58 = 0.1e1 / t57;
    constexpr double t78 = 0.3e1 / 0.1e2 * t32 * t57;
    constexpr double t122 = 0.1e1 / t34;
    constexpr double t123 = t32 * t122;


    const double t2 = rho_a <= dens_tol;
    const double t7 = rho_a + rho_b;
    const double t8 = 0.1e1 / t7;
    const double t11 = 0.2e1 * rho_a * t8 <= zeta_tol;
    const double t12 = zeta_tol - 0.1e1;
    const double t15 = 0.2e1 * rho_b * t8 <= zeta_tol;
    const double t16 = -t12;
    const double t17 = rho_a - rho_b;
    const double t19 = piecewise_functor_5( t11, t12, t15, t16, t17 * t8 );
    const double t20 = 0.1e1 + t19;
    const double t21 = t20 <= zeta_tol;
    const double t22 = safe_math::cbrt( zeta_tol );
    const double t23 = t22 * zeta_tol;
    const double t24 = safe_math::cbrt( t20 );
    const double t26 = piecewise_functor_3( t21, t23, t24 * t20 );
    const double t27 = t6 * t26;
    const double t28 = safe_math::cbrt( t7 );
    const double t38 = sigma_aa * sigma_aa;
    const double t39 = rho_a * rho_a;
    const double t40 = t39 * t39;
    const double t41 = t40 * rho_a;
    const double t42 = safe_math::cbrt( rho_a );
    const double t44 = 0.1e1 / t42 / t41;
    const double t45 = t38 * t44;
    const double t52 = safe_math::exp( -t37 * t45 * t48 / 0.576e3 );
    const double t56 = ( -0.162742215233874e0 * t30 * t52 + 0.1e2 / 0.81e2 ) * t31;
    const double t59 = t58 * sigma_aa;
    const double t60 = t42 * t42;
    const double t61 = t60 * t39;
    const double t62 = 0.1e1 / t61;
    const double t66 = k1 + t56 * t59 * t62 / 0.24e2;
    const double t70 = k1 * ( 0.1e1 - k1 / t66 );
    const double t71 = t60 * rho_a;
    const double t72 = 0.1e1 / t71;
    const double t74 = sigma_aa * t62;
    const double t76 = tau_a * t72 - t74 / 0.8e1;
    const double t79 = eta * sigma_aa;
    const double t82 = t78 + t79 * t62 / 0.8e1;
    const double t83 = 0.1e1 / t82;
    const double t84 = t76 * t83;
    const double t85 = t84 <= 0.e0;
    const double t86 = 0.e0 < t84;
    const double t87 = piecewise_functor_3( t86, 0.0, t84 );
    const double t88 = c1 * t87;
    const double t89 = 0.1e1 - t87;
    const double t90 = 0.1e1 / t89;
    const double t92 = safe_math::exp( -t88 * t90 );
    const double t93 = t84 <= 0.25e1;
    const double t94 = 0.25e1 < t84;
    const double t95 = piecewise_functor_3( t94, 0.25e1, t84 );
    const double t97 = t95 * t95;
    const double t99 = t97 * t95;
    const double t101 = t97 * t97;
    const double t103 = t101 * t95;
    const double t105 = t101 * t97;
    const double t110 = piecewise_functor_3( t94, t84, 0.25e1 );
    const double t111 = 0.1e1 - t110;
    const double t114 = safe_math::exp( c2 / t111 );
    const double t116 = piecewise_functor_5( t85, t92, t93, 0.1e1 - 0.667e0 * t95 - 0.4445555e0 * t97 - 0.663086601049e0 * t99 + 0.145129704449e1 * t101 - 0.887998041597e0 * t103 + 0.234528941479e0 * t105 - 0.23185843322e-1 * t101 * t99, -d * t114 );
    const double t117 = 0.174e0 - t70;
    const double t119 = t116 * t117 + t70 + 0.1e1;
    const double t120 = t28 * t119;
    const double t121 = safe_math::sqrt( 0.3e1 );
    const double t124 = safe_math::sqrt( sigma_aa );
    const double t125 = t42 * rho_a;
    const double t126 = 0.1e1 / t125;
    const double t128 = t123 * t124 * t126;
    const double t129 = safe_math::sqrt( t128 );
    const double t133 = safe_math::exp( -0.98958e1 * t121 / t129 );
    const double t134 = 0.1e1 - t133;
    const double t135 = t120 * t134;
    const double t138 = piecewise_functor_3( t2, 0.0, -0.3e1 / 0.8e1 * t27 * t135 );
    const double t139 = rho_b <= dens_tol;
    const double t140 = -t17;
    const double t142 = piecewise_functor_5( t15, t12, t11, t16, t140 * t8 );
    const double t143 = 0.1e1 + t142;
    const double t144 = t143 <= zeta_tol;
    const double t145 = safe_math::cbrt( t143 );
    const double t147 = piecewise_functor_3( t144, t23, t145 * t143 );
    const double t148 = t6 * t147;
    const double t149 = sigma_bb * sigma_bb;
    const double t150 = rho_b * rho_b;
    const double t151 = t150 * t150;
    const double t152 = t151 * rho_b;
    const double t153 = safe_math::cbrt( rho_b );
    const double t155 = 0.1e1 / t153 / t152;
    const double t156 = t149 * t155;
    const double t160 = safe_math::exp( -t37 * t156 * t48 / 0.576e3 );
    const double t164 = ( -0.162742215233874e0 * t30 * t160 + 0.1e2 / 0.81e2 ) * t31;
    const double t165 = t58 * sigma_bb;
    const double t166 = t153 * t153;
    const double t167 = t166 * t150;
    const double t168 = 0.1e1 / t167;
    const double t172 = k1 + t164 * t165 * t168 / 0.24e2;
    const double t176 = k1 * ( 0.1e1 - k1 / t172 );
    const double t177 = t166 * rho_b;
    const double t178 = 0.1e1 / t177;
    const double t180 = sigma_bb * t168;
    const double t182 = tau_b * t178 - t180 / 0.8e1;
    const double t183 = eta * sigma_bb;
    const double t186 = t78 + t183 * t168 / 0.8e1;
    const double t187 = 0.1e1 / t186;
    const double t188 = t182 * t187;
    const double t189 = t188 <= 0.e0;
    const double t190 = 0.e0 < t188;
    const double t191 = piecewise_functor_3( t190, 0.0, t188 );
    const double t192 = c1 * t191;
    const double t193 = 0.1e1 - t191;
    const double t194 = 0.1e1 / t193;
    const double t196 = safe_math::exp( -t192 * t194 );
    const double t197 = t188 <= 0.25e1;
    const double t198 = 0.25e1 < t188;
    const double t199 = piecewise_functor_3( t198, 0.25e1, t188 );
    const double t201 = t199 * t199;
    const double t203 = t201 * t199;
    const double t205 = t201 * t201;
    const double t207 = t205 * t199;
    const double t209 = t205 * t201;
    const double t214 = piecewise_functor_3( t198, t188, 0.25e1 );
    const double t215 = 0.1e1 - t214;
    const double t218 = safe_math::exp( c2 / t215 );
    const double t220 = piecewise_functor_5( t189, t196, t197, 0.1e1 - 0.667e0 * t199 - 0.4445555e0 * t201 - 0.663086601049e0 * t203 + 0.145129704449e1 * t205 - 0.887998041597e0 * t207 + 0.234528941479e0 * t209 - 0.23185843322e-1 * t205 * t203, -d * t218 );
    const double t221 = 0.174e0 - t176;
    const double t223 = t220 * t221 + t176 + 0.1e1;
    const double t224 = t28 * t223;
    const double t225 = safe_math::sqrt( sigma_bb );
    const double t226 = t153 * rho_b;
    const double t227 = 0.1e1 / t226;
    const double t229 = t123 * t225 * t227;
    const double t230 = safe_math::sqrt( t229 );
    const double t234 = safe_math::exp( -0.98958e1 * t121 / t230 );
    const double t235 = 0.1e1 - t234;
    const double t236 = t224 * t235;
    const double t239 = piecewise_functor_3( t139, 0.0, -0.3e1 / 0.8e1 * t148 * t236 );


    eps = t138 + t239;

  }